

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_59::InMemoryDirectory::Impl::openEntry(Impl *this,StringPtr name,WriteMode mode)

{
  undefined4 in_register_0000000c;
  StringPtr value;
  String local_48;
  String *pSStack_28;
  WriteMode mode_local;
  Impl *this_local;
  StringPtr name_local;
  
  value.content.size_ = (char *)CONCAT44(in_register_0000000c,mode);
  this_local = (Impl *)name.content.size_;
  value.content.ptr = value.content.size_;
  pSStack_28 = (String *)name.content.ptr;
  name_local.content.ptr = value.content.size_;
  name_local.content.size_ = (size_t)this;
  heapString(&local_48,(kj *)this_local,value);
  openEntry(this,(String *)name.content.ptr,(WriteMode)&local_48);
  String::~String(&local_48);
  return (Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)(EntryImpl *)this;
}

Assistant:

Maybe<EntryImpl&> openEntry(kj::StringPtr name, WriteMode mode) {
      // TODO(perf): We could avoid a copy if the entry exists, at the expense of a double-lookup
      //   if it doesn't. Maybe a better map implementation will solve everything?
      return openEntry(heapString(name), mode);
    }